

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  char cVar1;
  Curl_easy *data;
  undefined8 *puVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  CURLcode CVar7;
  CURLcode CVar8;
  char *pcVar9;
  size_t sVar10;
  curl_slist *pcVar11;
  curltime cVar12;
  char *rawPath;
  ftp_conn *local_58;
  size_t local_50;
  int ftpcode;
  int local_44;
  ssize_t nread;
  ssize_t nread_1;
  
  data = conn->data;
  puVar2 = (undefined8 *)(data->req).protop;
  rawPath = (char *)0x0;
  local_50 = 0;
  if (puVar2 == (undefined8 *)0x0) {
    return CURLE_OK;
  }
  if ((((CURLE_FILESIZE_EXCEEDED < status) ||
       ((0x80000010428e3601U >> ((ulong)status & 0x3f) & 1) == 0)) &&
      (status != CURLE_REMOTE_FILE_NOT_FOUND)) || (CVar7 = CURLE_OK, premature)) {
    (conn->proto).ftpc.ctl_valid = false;
    (conn->proto).ftpc.cwdfail = true;
    Curl_conncontrol(conn,1);
    CVar7 = status;
  }
  if (((data->state).field_0x514 & 0x80) != 0) {
    if (((data->set).chunk_end != (curl_chunk_end_callback)0x0) &&
       ((conn->proto).ftpc.file != (char *)0x0)) {
      Curl_set_in_callback(data,true);
      (*(data->set).chunk_end)((data->wildcard).customptr);
      Curl_set_in_callback(data,false);
    }
    (conn->proto).ftpc.known_filesize = -1;
  }
  local_58 = (ftp_conn *)&conn->proto;
  if ((CVar7 == CURLE_OK) &&
     (CVar7 = Curl_urldecode(data,(char *)*puVar2,0,&rawPath,&local_50,true), CVar7 == CURLE_OK)) {
    if (((data->set).ftp_filemethod == FTPFILE_NOCWD) && (*rawPath == '/')) {
      (*Curl_cfree)(rawPath);
      pcVar9 = (conn->proto).ftpc.prevpath;
    }
    else {
      (*Curl_cfree)((conn->proto).ftpc.prevpath);
      if ((conn->proto).ftpc.cwdfail != false) {
        (*Curl_cfree)(rawPath);
        (conn->proto).ftpc.prevpath = (char *)0x0;
        CVar7 = CURLE_OK;
        bVar6 = true;
        goto LAB_001150a7;
      }
      if ((data->set).ftp_filemethod == FTPFILE_NOCWD) {
        local_50 = 0;
      }
      else {
        pcVar9 = (conn->proto).ftpc.file;
        if (pcVar9 == (char *)0x0) {
          sVar10 = 0;
        }
        else {
          sVar10 = strlen(pcVar9);
        }
        local_50 = local_50 - sVar10;
      }
      rawPath[local_50] = '\0';
      (conn->proto).ftpc.prevpath = rawPath;
      pcVar9 = rawPath;
    }
    bVar6 = true;
    if (pcVar9 == (char *)0x0) {
      CVar7 = CURLE_OK;
    }
    else {
      CVar7 = CURLE_OK;
      Curl_infof(data,"Remembering we are in dir \"%s\"\n");
    }
  }
  else {
    (conn->proto).ftpc.ctl_valid = false;
    Curl_conncontrol(conn,1);
    (*Curl_cfree)((conn->proto).ftpc.prevpath);
    (conn->proto).ftpc.prevpath = (char *)0x0;
    bVar6 = false;
  }
LAB_001150a7:
  freedirs(local_58);
  if (conn->sock[1] != -1) {
    if (((bVar6) && (CVar7 = CURLE_OK, (conn->proto).ftpc.dont_check == true)) &&
       (0 < (data->req).maxdownload)) {
      CVar8 = Curl_pp_sendf(&local_58->pp,"%s","ABOR");
      CVar7 = CURLE_OK;
      if (CVar8 != CURLE_OK) {
        pcVar9 = curl_easy_strerror(CVar8);
        Curl_failf(data,"Failure sending ABOR command: %s",pcVar9);
        (conn->proto).ftpc.ctl_valid = false;
        Curl_conncontrol(conn,1);
        CVar7 = CVar8;
      }
    }
    if ((conn->ssl[1].field_0x10 & 1) != 0) {
      Curl_ssl_close(conn,1);
    }
    close_secondarysocket(conn);
  }
  if (CVar7 != CURLE_OK) goto LAB_0011517e;
  if (((*(int *)(puVar2 + 2) != 0) || ((conn->proto).ftpc.ctl_valid != true)) ||
     ((conn->proto).sshc.authed != true || premature)) {
LAB_00115172:
    CVar7 = CURLE_OK;
    CVar8 = CURLE_OK;
    if (premature) goto LAB_0011517e;
    uVar3 = *(ulong *)&(data->set).field_0x8e8;
    if (((uint)uVar3 >> 0x1d & 1) == 0) {
      lVar4 = (data->req).size;
      if (((lVar4 == -1) || (lVar5 = (data->req).bytecount, lVar4 == lVar5)) ||
         (((data->state).crlf_conversions + lVar4 == lVar5 || ((data->req).maxdownload == lVar5))))
      {
        if ((((conn->proto).ftpc.dont_check == false) && (0 < lVar4)) &&
           (CVar7 = CVar8, (data->req).bytecount == 0)) {
          Curl_failf(data,"No data was received!");
          CVar7 = CURLE_FTP_COULDNT_RETR_FILE;
        }
        goto LAB_0011517e;
      }
      Curl_failf(data,"Received only partial file: %ld bytes");
    }
    else {
      lVar4 = (data->state).infilesize;
      CVar7 = CVar8;
      if ((((lVar4 == -1) || ((uVar3 & 0x40) != 0)) || (lVar4 == (data->req).writebytecount)) ||
         (*(int *)(puVar2 + 2) != 0)) goto LAB_0011517e;
      Curl_failf(data,"Uploaded unaligned file size (%ld out of %ld bytes)",(data->req).bytecount);
    }
  }
  else {
    lVar4 = (conn->proto).ftpc.pp.response_time;
    (conn->proto).ftpc.pp.response_time = 60000;
    cVar12 = Curl_now();
    (conn->proto).smbc.send_size = cVar12.tv_sec;
    *(int *)((long)&conn->proto + 0x48) = cVar12.tv_usec;
    CVar7 = Curl_GetFTPResponse(&nread,conn,&ftpcode);
    (conn->proto).ftpc.pp.response_time = lVar4;
    if (CVar7 == CURLE_OPERATION_TIMEDOUT && nread == 0) {
      Curl_failf(data,"control connection looks dead");
      (conn->proto).ftpc.ctl_valid = false;
      Curl_conncontrol(conn,1);
      return CURLE_OPERATION_TIMEDOUT;
    }
    if (CVar7 != CURLE_OK) {
      return CVar7;
    }
    if ((conn->proto).ftpc.dont_check == true) {
      if (0 < (data->req).maxdownload) {
        Curl_infof(data,"partial download completed, closing connection\n");
        Curl_conncontrol(conn,1);
        return CURLE_OK;
      }
      goto LAB_00115172;
    }
    if ((ftpcode == 0xe2) || (ftpcode == 0xfa)) goto LAB_00115172;
    Curl_failf(data,"server did not report OK, got %d");
  }
  CVar7 = CURLE_PARTIAL_FILE;
LAB_0011517e:
  *(undefined4 *)(puVar2 + 2) = 0;
  (conn->proto).ftpc.dont_check = false;
  if ((status == CURLE_OK && CVar7 == CURLE_OK) && !premature) {
    pcVar11 = (data->set).postquote;
    CVar7 = CURLE_OK;
    if (pcVar11 != (curl_slist *)0x0) {
      for (; CVar7 = CURLE_OK, pcVar11 != (curl_slist *)0x0; pcVar11 = pcVar11->next) {
        pcVar9 = pcVar11->data;
        if (pcVar9 != (char *)0x0) {
          cVar1 = *pcVar9;
          CVar7 = Curl_pp_sendf(&local_58->pp,"%s",pcVar9 + (cVar1 == '*'));
          if (CVar7 != CURLE_OK) break;
          cVar12 = Curl_now();
          (conn->proto).smbc.send_size = cVar12.tv_sec;
          *(int *)((long)&conn->proto + 0x48) = cVar12.tv_usec;
          CVar7 = Curl_GetFTPResponse(&nread_1,conn,&local_44);
          if (CVar7 != CURLE_OK) break;
          if ((cVar1 != '*') && (399 < local_44)) {
            Curl_failf(conn->data,"QUOT string not accepted: %s",pcVar9);
            CVar7 = CURLE_QUOTE_ERROR;
            break;
          }
        }
      }
    }
  }
  (*Curl_cfree)((void *)puVar2[1]);
  puVar2[1] = 0;
  return CVar7;
}

Assistant:

static CURLcode ftp_done(struct connectdata *conn, CURLcode status,
                         bool premature)
{
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  ssize_t nread;
  int ftpcode;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL;
  size_t pathLen = 0;

  if(!ftp)
    return CURLE_OK;

  switch(status) {
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_PARTIAL_FILE:
  case CURLE_UPLOAD_FAILED:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
  case CURLE_WRITE_ERROR:
    /* the connection stays alive fine even though this happened */
    /* fall-through */
  case CURLE_OK: /* doesn't affect the control connection's status */
    if(!premature)
      break;

    /* until we cope better with prematurely ended requests, let them
     * fallback as if in complete failure */
    /* FALLTHROUGH */
  default:       /* by default, an error means the control connection is
                    wedged and should not be used anymore */
    ftpc->ctl_valid = FALSE;
    ftpc->cwdfail = TRUE; /* set this TRUE to prevent us to remember the
                             current path, as this connection is going */
    connclose(conn, "FTP ended with bad error code");
    result = status;      /* use the already set error code */
    break;
  }

  if(data->state.wildcardmatch) {
    if(data->set.chunk_end && ftpc->file) {
      Curl_set_in_callback(data, true);
      data->set.chunk_end(data->wildcard.customptr);
      Curl_set_in_callback(data, false);
    }
    ftpc->known_filesize = -1;
  }

  if(!result)
    /* get the url-decoded "raw" path */
    result = Curl_urldecode(data, ftp->path, 0, &rawPath, &pathLen, TRUE);
  if(result) {
    /* We can limp along anyway (and should try to since we may already be in
     * the error path) */
    ftpc->ctl_valid = FALSE; /* mark control connection as bad */
    connclose(conn, "FTP: out of memory!"); /* mark for connection closure */
    free(ftpc->prevpath);
    ftpc->prevpath = NULL; /* no path remembering */
  }
  else { /* remember working directory for connection reuse */
    if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
      free(rawPath); /* full path => no CWDs happened => keep ftpc->prevpath */
    else {
      free(ftpc->prevpath);

      if(!ftpc->cwdfail) {
        if(data->set.ftp_filemethod == FTPFILE_NOCWD)
          pathLen = 0; /* relative path => working directory is FTP home */
        else
          pathLen -= ftpc->file?strlen(ftpc->file):0; /* file is url-decoded */

        rawPath[pathLen] = '\0';
        ftpc->prevpath = rawPath;
      }
      else {
        free(rawPath);
        ftpc->prevpath = NULL; /* no path */
      }
    }

    if(ftpc->prevpath)
      infof(data, "Remembering we are in dir \"%s\"\n", ftpc->prevpath);
  }

  /* free the dir tree and file parts */
  freedirs(ftpc);

  /* shut down the socket to inform the server we're done */

#ifdef _WIN32_WCE
  shutdown(conn->sock[SECONDARYSOCKET], 2);  /* SD_BOTH */
#endif

  if(conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) {
    if(!result && ftpc->dont_check && data->req.maxdownload > 0) {
      /* partial download completed */
      result = Curl_pp_sendf(pp, "%s", "ABOR");
      if(result) {
        failf(data, "Failure sending ABOR command: %s",
              curl_easy_strerror(result));
        ftpc->ctl_valid = FALSE; /* mark control connection as bad */
        connclose(conn, "ABOR command failed"); /* connection closure */
      }
    }

    if(conn->ssl[SECONDARYSOCKET].use) {
      /* The secondary socket is using SSL so we must close down that part
         first before we close the socket for real */
      Curl_ssl_close(conn, SECONDARYSOCKET);

      /* Note that we keep "use" set to TRUE since that (next) connection is
         still requested to use SSL */
    }
    close_secondarysocket(conn);
  }

  if(!result && (ftp->transfer == FTPTRANSFER_BODY) && ftpc->ctl_valid &&
     pp->pending_resp && !premature) {
    /*
     * Let's see what the server says about the transfer we just performed,
     * but lower the timeout as sometimes this connection has died while the
     * data has been transferred. This happens when doing through NATs etc that
     * abandon old silent connections.
     */
    long old_time = pp->response_time;

    pp->response_time = 60*1000; /* give it only a minute for now */
    pp->response = Curl_now(); /* timeout relative now */

    result = Curl_GetFTPResponse(&nread, conn, &ftpcode);

    pp->response_time = old_time; /* set this back to previous value */

    if(!nread && (CURLE_OPERATION_TIMEDOUT == result)) {
      failf(data, "control connection looks dead");
      ftpc->ctl_valid = FALSE; /* mark control connection as bad */
      connclose(conn, "Timeout or similar in FTP DONE operation"); /* close */
    }

    if(result)
      return result;

    if(ftpc->dont_check && data->req.maxdownload > 0) {
      /* we have just sent ABOR and there is no reliable way to check if it was
       * successful or not; we have to close the connection now */
      infof(data, "partial download completed, closing connection\n");
      connclose(conn, "Partial download with no ability to check");
      return result;
    }

    if(!ftpc->dont_check) {
      /* 226 Transfer complete, 250 Requested file action okay, completed. */
      if((ftpcode != 226) && (ftpcode != 250)) {
        failf(data, "server did not report OK, got %d", ftpcode);
        result = CURLE_PARTIAL_FILE;
      }
    }
  }

  if(result || premature)
    /* the response code from the transfer showed an error already so no
       use checking further */
    ;
  else if(data->set.upload) {
    if((-1 != data->state.infilesize) &&
       (data->state.infilesize != data->req.writebytecount) &&
       !data->set.crlf &&
       (ftp->transfer == FTPTRANSFER_BODY)) {
      failf(data, "Uploaded unaligned file size (%" CURL_FORMAT_CURL_OFF_T
            " out of %" CURL_FORMAT_CURL_OFF_T " bytes)",
            data->req.bytecount, data->state.infilesize);
      result = CURLE_PARTIAL_FILE;
    }
  }
  else {
    if((-1 != data->req.size) &&
       (data->req.size != data->req.bytecount) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs, so
        * we'll check to see if the discrepancy can be explained by the number
        * of CRLFs we've changed to LFs.
        */
       ((data->req.size + data->state.crlf_conversions) !=
        data->req.bytecount) &&
#endif /* CURL_DO_LINEEND_CONV */
       (data->req.maxdownload != data->req.bytecount)) {
      failf(data, "Received only partial file: %" CURL_FORMAT_CURL_OFF_T
            " bytes", data->req.bytecount);
      result = CURLE_PARTIAL_FILE;
    }
    else if(!ftpc->dont_check &&
            !data->req.bytecount &&
            (data->req.size>0)) {
      failf(data, "No data was received!");
      result = CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  /* clear these for next connection */
  ftp->transfer = FTPTRANSFER_BODY;
  ftpc->dont_check = FALSE;

  /* Send any post-transfer QUOTE strings? */
  if(!status && !result && !premature && data->set.postquote)
    result = ftp_sendquote(conn, data->set.postquote);
  Curl_safefree(ftp->pathalloc);
  return result;
}